

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O2

void mp_cond_swap(mp_int *x0,mp_int *x1,uint swap)

{
  ulong *puVar1;
  size_t sVar2;
  ulong uVar3;
  BignumInt *pBVar4;
  size_t i;
  size_t sVar5;
  ulong uVar6;
  BignumInt mask;
  
  sVar2 = x0->nw;
  if (sVar2 == x1->nw) {
    for (sVar5 = 0; sVar2 != sVar5; sVar5 = sVar5 + 1) {
      uVar3 = x0->w[sVar5];
      pBVar4 = x1->w;
      uVar6 = (pBVar4[sVar5] ^ uVar3) & -(ulong)(swap & 1);
      x0->w[sVar5] = uVar3 ^ uVar6;
      puVar1 = pBVar4 + sVar5;
      *puVar1 = *puVar1 ^ uVar6;
    }
    return;
  }
  __assert_fail("x0->nw == x1->nw",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/mpint.c",
                0xa6,"void mp_cond_swap(mp_int *, mp_int *, unsigned int)");
}

Assistant:

void mp_cond_swap(mp_int *x0, mp_int *x1, unsigned swap)
{
    assert(x0->nw == x1->nw);
    volatile BignumInt mask = -(BignumInt)(1 & swap);
    for (size_t i = 0; i < x0->nw; i++) {
        BignumInt diff = (x0->w[i] ^ x1->w[i]) & mask;
        x0->w[i] ^= diff;
        x1->w[i] ^= diff;
    }
}